

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

civil_lookup *
absl::lts_20250127::time_internal::cctz::anon_unknown_0::MakeRepeated
          (civil_lookup *__return_storage_ptr__,Transition *tr,civil_second *cs)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  diff_t dVar7;
  
  __return_storage_ptr__->kind = REPEATED;
  lVar1 = tr->unix_time;
  uVar2._0_1_ = (tr->prev_civil_sec).f_.m;
  uVar2._1_1_ = (tr->prev_civil_sec).f_.d;
  uVar2._2_1_ = (tr->prev_civil_sec).f_.hh;
  uVar2._3_1_ = (tr->prev_civil_sec).f_.mm;
  uVar2._4_1_ = (tr->prev_civil_sec).f_.ss;
  uVar2._5_3_ = *(undefined3 *)&(tr->prev_civil_sec).f_.field_0xd;
  uVar3._0_1_ = (cs->f_).m;
  uVar3._1_1_ = (cs->f_).d;
  uVar3._2_1_ = (cs->f_).hh;
  uVar3._3_1_ = (cs->f_).mm;
  uVar3._4_1_ = (cs->f_).ss;
  uVar3._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
  uVar6 = detail::difference((detail *)(tr->prev_civil_sec).f_.y,uVar2,(cs->f_).y,uVar3);
  (__return_storage_ptr__->pre).__d.__r = ~uVar6 + lVar1;
  lVar1 = tr->unix_time;
  (__return_storage_ptr__->trans).__d.__r = lVar1;
  uVar4._0_1_ = (cs->f_).m;
  uVar4._1_1_ = (cs->f_).d;
  uVar4._2_1_ = (cs->f_).hh;
  uVar4._3_1_ = (cs->f_).mm;
  uVar4._4_1_ = (cs->f_).ss;
  uVar4._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
  uVar5._0_1_ = (tr->civil_sec).f_.m;
  uVar5._1_1_ = (tr->civil_sec).f_.d;
  uVar5._2_1_ = (tr->civil_sec).f_.hh;
  uVar5._3_1_ = (tr->civil_sec).f_.mm;
  uVar5._4_1_ = (tr->civil_sec).f_.ss;
  uVar5._5_3_ = *(undefined3 *)&(tr->civil_sec).f_.field_0xd;
  dVar7 = detail::difference((detail *)(cs->f_).y,uVar4,(tr->civil_sec).f_.y,uVar5);
  (__return_storage_ptr__->post).__d.__r = dVar7 + lVar1;
  return __return_storage_ptr__;
}

Assistant:

inline time_zone::civil_lookup MakeRepeated(const Transition& tr,
                                            const civil_second& cs) {
  time_zone::civil_lookup cl;
  cl.kind = time_zone::civil_lookup::REPEATED;
  cl.pre = FromUnixSeconds(tr.unix_time - 1 - (tr.prev_civil_sec - cs));
  cl.trans = FromUnixSeconds(tr.unix_time);
  cl.post = FromUnixSeconds(tr.unix_time + (cs - tr.civil_sec));
  return cl;
}